

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode httpauth(Curl_easy *data,_Bool proxy,__va_list_tag *param)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  ulong *local_50;
  int local_34;
  _Bool iestyle;
  _Bool authbits;
  ulong uStack_30;
  int bitcheck;
  unsigned_long auth;
  __va_list_tag *param_local;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  uVar1 = param->gp_offset;
  if (uVar1 < 0x29) {
    local_50 = (ulong *)((long)(int)uVar1 + (long)param->reg_save_area);
    param->gp_offset = uVar1 + 8;
  }
  else {
    local_50 = (ulong *)param->overflow_arg_area;
    param->overflow_arg_area = local_50 + 1;
  }
  uStack_30 = *local_50;
  if (uStack_30 != 0) {
    local_34 = 0;
    bVar2 = false;
    bVar4 = (uStack_30 & 0x10) != 0;
    if (proxy) {
      (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfb | bVar4 << 2;
    }
    else {
      (data->state).authhost.field_0x18 = (data->state).authhost.field_0x18 & 0xfb | bVar4 << 2;
    }
    if ((uStack_30 & 0x10) != 0) {
      uStack_30 = uStack_30 & 0xffffffffffffffef | 2;
    }
    uStack_30 = uStack_30 & 0xfffffffffffffffb;
    do {
      if (0x1e < local_34) goto LAB_001889f6;
      bVar3 = (byte)local_34;
      local_34 = local_34 + 1;
    } while ((uStack_30 & 1L << (bVar3 & 0x3f)) == 0);
    bVar2 = true;
LAB_001889f6:
    if (!bVar2) {
      return CURLE_NOT_BUILT_IN;
    }
  }
  if (proxy) {
    (data->set).proxyauth = uStack_30;
  }
  else {
    (data->set).httpauth = uStack_30;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode httpauth(struct Curl_easy *data, bool proxy, va_list param)
{
  unsigned long auth = va_arg(param, unsigned long);

  if(auth != CURLAUTH_NONE) {
    int bitcheck = 0;
    bool authbits = FALSE;
    /* the DIGEST_IE bit is only used to set a special marker, for all the
       rest we need to handle it as normal DIGEST */
    bool iestyle = !!(auth & CURLAUTH_DIGEST_IE);
    if(proxy)
      data->state.authproxy.iestyle = iestyle;
    else
      data->state.authhost.iestyle = iestyle;

    if(auth & CURLAUTH_DIGEST_IE) {
      auth |= CURLAUTH_DIGEST; /* set standard digest bit */
      auth &= ~CURLAUTH_DIGEST_IE; /* unset ie digest bit */
    }

    /* switch off bits we cannot support */
#ifndef USE_NTLM
    auth &= ~CURLAUTH_NTLM;    /* no NTLM support */
#endif
#ifndef USE_SPNEGO
    auth &= ~CURLAUTH_NEGOTIATE; /* no Negotiate (SPNEGO) auth without GSS-API
                                    or SSPI */
#endif

    /* check if any auth bit lower than CURLAUTH_ONLY is still set */
    while(bitcheck < 31) {
      if(auth & (1UL << bitcheck++)) {
        authbits = TRUE;
        break;
      }
    }
    if(!authbits)
      return CURLE_NOT_BUILT_IN; /* no supported types left! */
  }
  if(proxy)
    data->set.proxyauth = auth;
  else
    data->set.httpauth = auth;
  return CURLE_OK;
}